

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O2

JDIMENSION jpeg_read_scanlines(j_decompress_ptr cinfo,JSAMPARRAY scanlines,JDIMENSION max_lines)

{
  int iVar1;
  uint uVar2;
  jpeg_error_mgr *pjVar3;
  jpeg_progress_mgr *pjVar4;
  uint in_EAX;
  uint uStack_28;
  JDIMENSION row_ctr;
  
  iVar1 = cinfo->global_state;
  uStack_28 = in_EAX;
  if (iVar1 != 0xcd) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x15;
    (pjVar3->msg_parm).i[0] = iVar1;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  uVar2 = cinfo->output_height;
  if (cinfo->output_scanline < uVar2) {
    pjVar4 = cinfo->progress;
    if (pjVar4 != (jpeg_progress_mgr *)0x0) {
      pjVar4->pass_counter = (ulong)cinfo->output_scanline;
      pjVar4->pass_limit = (ulong)uVar2;
      (*pjVar4->progress_monitor)((j_common_ptr)cinfo);
    }
    _uStack_28 = (ulong)uStack_28;
    (*cinfo->main->process_data)(cinfo,scanlines,&row_ctr,max_lines);
    cinfo->output_scanline = cinfo->output_scanline + row_ctr;
  }
  else {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x7e;
    (*pjVar3->emit_message)((j_common_ptr)cinfo,-1);
    row_ctr = 0;
  }
  return row_ctr;
}

Assistant:

GLOBAL(JDIMENSION)
jpeg_read_scanlines (j_decompress_ptr cinfo, JSAMPARRAY scanlines,
		     JDIMENSION max_lines)
{
  JDIMENSION row_ctr;

  if (cinfo->global_state != DSTATE_SCANNING)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  if (cinfo->output_scanline >= cinfo->output_height) {
    WARNMS(cinfo, JWRN_TOO_MUCH_DATA);
    return 0;
  }

  /* Call progress monitor hook if present */
  if (cinfo->progress != NULL) {
    cinfo->progress->pass_counter = (long) cinfo->output_scanline;
    cinfo->progress->pass_limit = (long) cinfo->output_height;
    (*cinfo->progress->progress_monitor) ((j_common_ptr) cinfo);
  }

  /* Process some data */
  row_ctr = 0;
  (*cinfo->main->process_data) (cinfo, scanlines, &row_ctr, max_lines);
  cinfo->output_scanline += row_ctr;
  return row_ctr;
}